

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_uint64 ma_dr_wav_read_pcm_frames_s16__msadpcm
                    (ma_dr_wav *pWav,ma_uint64 framesToRead,ma_int16 *pBufferOut)

{
  ma_int16 mVar1;
  long lVar2;
  long in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  bool bVar3;
  ma_int32 newSample1_1;
  ma_int32 newSample0_1;
  ma_int32 newSample1;
  ma_int32 newSample0;
  ma_int32 nibble1;
  ma_int32 nibble0;
  ma_uint8 nibbles;
  ma_uint32 iSample;
  ma_uint8 header_1 [14];
  ma_uint8 header [7];
  ma_uint64 totalFramesRead;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  uint local_50;
  uint local_4c;
  byte local_45;
  uint local_44;
  byte local_3d;
  byte local_3c;
  byte local_2f [7];
  ma_uint64 local_28;
  long local_20;
  long local_18;
  undefined8 *local_10;
  
  local_28 = 0;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  do {
    if ((ulong)local_10[0xf] <= (ulong)local_10[0x13]) {
      return local_28;
    }
    if ((*(int *)(local_10 + 0x24) == 0) && (*(int *)(local_10 + 0x20) == 0)) {
      if (*(short *)(local_10 + 0xe) == 1) {
        lVar2 = (*(code *)*local_10)(local_10[3],local_2f,7);
        if (lVar2 != 7) {
          return local_28;
        }
        *(uint *)(local_10 + 0x20) = *(ushort *)(local_10 + 10) - 7;
        *(ushort *)((long)local_10 + 0x104) = (ushort)local_2f[0];
        mVar1 = ma_dr_wav_bytes_to_s16((ma_uint8 *)0x24d615);
        *(int *)(local_10 + 0x21) = (int)mVar1;
        mVar1 = ma_dr_wav_bytes_to_s16((ma_uint8 *)0x24d634);
        *(int *)(local_10 + 0x25) = (int)mVar1;
        mVar1 = ma_dr_wav_bytes_to_s16((ma_uint8 *)0x24d653);
        *(int *)((long)local_10 + 0x124) = (int)mVar1;
        *(undefined4 *)(local_10 + 0x23) = *(undefined4 *)((long)local_10 + 0x124);
        *(undefined4 *)((long)local_10 + 0x11c) = *(undefined4 *)(local_10 + 0x25);
        *(undefined4 *)(local_10 + 0x24) = 2;
        if (6 < *(ushort *)((long)local_10 + 0x104)) {
          return local_28;
        }
      }
      else {
        lVar2 = (*(code *)*local_10)(local_10[3],&local_3d,0xe);
        if (lVar2 != 0xe) {
          return local_28;
        }
        *(uint *)(local_10 + 0x20) = *(ushort *)(local_10 + 10) - 0xe;
        *(ushort *)((long)local_10 + 0x104) = (ushort)local_3d;
        *(ushort *)((long)local_10 + 0x106) = (ushort)local_3c;
        mVar1 = ma_dr_wav_bytes_to_s16((ma_uint8 *)0x24d771);
        *(int *)(local_10 + 0x21) = (int)mVar1;
        mVar1 = ma_dr_wav_bytes_to_s16((ma_uint8 *)0x24d790);
        *(int *)((long)local_10 + 0x10c) = (int)mVar1;
        mVar1 = ma_dr_wav_bytes_to_s16((ma_uint8 *)0x24d7af);
        *(int *)(local_10 + 0x25) = (int)mVar1;
        mVar1 = ma_dr_wav_bytes_to_s16((ma_uint8 *)0x24d7ce);
        *(int *)(local_10 + 0x26) = (int)mVar1;
        mVar1 = ma_dr_wav_bytes_to_s16((ma_uint8 *)0x24d7ed);
        *(int *)((long)local_10 + 0x124) = (int)mVar1;
        mVar1 = ma_dr_wav_bytes_to_s16((ma_uint8 *)0x24d80c);
        *(int *)((long)local_10 + 300) = (int)mVar1;
        *(undefined4 *)(local_10 + 0x22) = *(undefined4 *)((long)local_10 + 0x124);
        *(undefined4 *)((long)local_10 + 0x114) = *(undefined4 *)((long)local_10 + 300);
        *(undefined4 *)(local_10 + 0x23) = *(undefined4 *)(local_10 + 0x25);
        *(undefined4 *)((long)local_10 + 0x11c) = *(undefined4 *)(local_10 + 0x26);
        *(undefined4 *)(local_10 + 0x24) = 2;
        if ((6 < *(ushort *)((long)local_10 + 0x104)) || (6 < *(ushort *)((long)local_10 + 0x106)))
        {
          return local_28;
        }
      }
    }
    while( true ) {
      bVar3 = false;
      if ((local_18 != 0) && (bVar3 = false, *(int *)(local_10 + 0x24) != 0)) {
        bVar3 = (ulong)local_10[0x13] < (ulong)local_10[0xf];
      }
      if (!bVar3) break;
      if (local_20 != 0) {
        for (local_44 = 0; local_44 < *(ushort *)(local_10 + 0xe); local_44 = local_44 + 1) {
          *(short *)(local_20 + (ulong)local_44 * 2) =
               (short)*(undefined4 *)
                       ((long)local_10 +
                       ((4 - (ulong)(*(int *)(local_10 + 0x24) * (uint)*(ushort *)(local_10 + 0xe)))
                       + (ulong)local_44) * 4 + 0x110);
        }
        local_20 = local_20 + (long)(int)(uint)*(ushort *)(local_10 + 0xe) * 2;
      }
      local_18 = local_18 + -1;
      local_28 = local_28 + 1;
      local_10[0x13] = local_10[0x13] + 1;
      *(int *)(local_10 + 0x24) = *(int *)(local_10 + 0x24) + -1;
    }
    if (local_18 == 0) {
      return local_28;
    }
    if ((*(int *)(local_10 + 0x24) == 0) && (*(int *)(local_10 + 0x20) != 0)) {
      lVar2 = (*(code *)*local_10)(local_10[3],&local_45,1);
      if (lVar2 != 1) {
        return local_28;
      }
      *(int *)(local_10 + 0x20) = *(int *)(local_10 + 0x20) + -1;
      local_4c = (int)(local_45 & 0xf0) >> 4;
      if ((local_45 & 0x80) != 0) {
        local_4c = local_4c | 0xfffffff0;
      }
      local_50 = local_45 & 0xf;
      if ((local_45 & 8) != 0) {
        local_50 = local_50 | 0xfffffff0;
      }
      if (*(short *)(local_10 + 0xe) == 1) {
        local_70 = local_4c * *(int *)(local_10 + 0x21) +
                   (*(int *)(local_10 + 0x25) *
                    ma_dr_wav_read_pcm_frames_s16__msadpcm::coeff1Table
                    [*(ushort *)((long)local_10 + 0x104)] +
                    *(int *)((long)local_10 + 0x124) *
                    ma_dr_wav_read_pcm_frames_s16__msadpcm::coeff2Table
                    [*(ushort *)((long)local_10 + 0x104)] >> 8);
        local_68 = local_70;
        if (0x7fff < local_70) {
          local_68 = 0x7fff;
        }
        if (local_68 < -0x8000) {
          local_6c = -0x8000;
        }
        else {
          if (0x7fff < local_70) {
            local_70 = 0x7fff;
          }
          local_6c = local_70;
        }
        *(ma_int32 *)(local_10 + 0x21) =
             ma_dr_wav_read_pcm_frames_s16__msadpcm::adaptationTable[(int)(local_45 & 0xf0) >> 4] *
             *(int *)(local_10 + 0x21) >> 8;
        if (*(int *)(local_10 + 0x21) < 0x10) {
          *(undefined4 *)(local_10 + 0x21) = 0x10;
        }
        *(undefined4 *)((long)local_10 + 0x124) = *(undefined4 *)(local_10 + 0x25);
        *(int *)(local_10 + 0x25) = local_6c;
        local_7c = local_50 * *(int *)(local_10 + 0x21) +
                   (*(int *)(local_10 + 0x25) *
                    ma_dr_wav_read_pcm_frames_s16__msadpcm::coeff1Table
                    [*(ushort *)((long)local_10 + 0x104)] +
                    *(int *)((long)local_10 + 0x124) *
                    ma_dr_wav_read_pcm_frames_s16__msadpcm::coeff2Table
                    [*(ushort *)((long)local_10 + 0x104)] >> 8);
        local_74 = local_7c;
        if (0x7fff < local_7c) {
          local_74 = 0x7fff;
        }
        if (local_74 < -0x8000) {
          local_78 = -0x8000;
        }
        else {
          if (0x7fff < local_7c) {
            local_7c = 0x7fff;
          }
          local_78 = local_7c;
        }
        *(ma_int32 *)(local_10 + 0x21) =
             ma_dr_wav_read_pcm_frames_s16__msadpcm::adaptationTable[(int)(local_45 & 0xf)] *
             *(int *)(local_10 + 0x21) >> 8;
        if (*(int *)(local_10 + 0x21) < 0x10) {
          *(undefined4 *)(local_10 + 0x21) = 0x10;
        }
        *(undefined4 *)((long)local_10 + 0x124) = *(undefined4 *)(local_10 + 0x25);
        *(int *)(local_10 + 0x25) = local_78;
        *(int *)(local_10 + 0x23) = local_6c;
        *(int *)((long)local_10 + 0x11c) = local_78;
        *(undefined4 *)(local_10 + 0x24) = 2;
      }
      else {
        local_88 = local_4c * *(int *)(local_10 + 0x21) +
                   (*(int *)(local_10 + 0x25) *
                    ma_dr_wav_read_pcm_frames_s16__msadpcm::coeff1Table
                    [*(ushort *)((long)local_10 + 0x104)] +
                    *(int *)((long)local_10 + 0x124) *
                    ma_dr_wav_read_pcm_frames_s16__msadpcm::coeff2Table
                    [*(ushort *)((long)local_10 + 0x104)] >> 8);
        local_80 = local_88;
        if (0x7fff < local_88) {
          local_80 = 0x7fff;
        }
        if (local_80 < -0x8000) {
          local_84 = -0x8000;
        }
        else {
          if (0x7fff < local_88) {
            local_88 = 0x7fff;
          }
          local_84 = local_88;
        }
        *(ma_int32 *)(local_10 + 0x21) =
             ma_dr_wav_read_pcm_frames_s16__msadpcm::adaptationTable[(int)(local_45 & 0xf0) >> 4] *
             *(int *)(local_10 + 0x21) >> 8;
        if (*(int *)(local_10 + 0x21) < 0x10) {
          *(undefined4 *)(local_10 + 0x21) = 0x10;
        }
        *(undefined4 *)((long)local_10 + 0x124) = *(undefined4 *)(local_10 + 0x25);
        *(int *)(local_10 + 0x25) = local_84;
        local_94 = local_50 * *(int *)((long)local_10 + 0x10c) +
                   (*(int *)(local_10 + 0x26) *
                    ma_dr_wav_read_pcm_frames_s16__msadpcm::coeff1Table
                    [*(ushort *)((long)local_10 + 0x106)] +
                    *(int *)((long)local_10 + 300) *
                    ma_dr_wav_read_pcm_frames_s16__msadpcm::coeff2Table
                    [*(ushort *)((long)local_10 + 0x106)] >> 8);
        local_8c = local_94;
        if (0x7fff < local_94) {
          local_8c = 0x7fff;
        }
        if (local_8c < -0x8000) {
          local_90 = -0x8000;
        }
        else {
          if (0x7fff < local_94) {
            local_94 = 0x7fff;
          }
          local_90 = local_94;
        }
        *(ma_int32 *)((long)local_10 + 0x10c) =
             ma_dr_wav_read_pcm_frames_s16__msadpcm::adaptationTable[(int)(local_45 & 0xf)] *
             *(int *)((long)local_10 + 0x10c) >> 8;
        if (*(int *)((long)local_10 + 0x10c) < 0x10) {
          *(undefined4 *)((long)local_10 + 0x10c) = 0x10;
        }
        *(undefined4 *)((long)local_10 + 300) = *(undefined4 *)(local_10 + 0x26);
        *(int *)(local_10 + 0x26) = local_90;
        *(int *)(local_10 + 0x23) = local_84;
        *(int *)((long)local_10 + 0x11c) = local_90;
        *(undefined4 *)(local_10 + 0x24) = 1;
      }
    }
  } while( true );
}

Assistant:

MA_PRIVATE ma_uint64 ma_dr_wav_read_pcm_frames_s16__msadpcm(ma_dr_wav* pWav, ma_uint64 framesToRead, ma_int16* pBufferOut)
{
    ma_uint64 totalFramesRead = 0;
    static ma_int32 adaptationTable[] = {
        230, 230, 230, 230, 307, 409, 512, 614,
        768, 614, 512, 409, 307, 230, 230, 230
    };
    static ma_int32 coeff1Table[] = { 256, 512, 0, 192, 240, 460,  392 };
    static ma_int32 coeff2Table[] = { 0,  -256, 0, 64,  0,  -208, -232 };
    MA_DR_WAV_ASSERT(pWav != NULL);
    MA_DR_WAV_ASSERT(framesToRead > 0);
    while (pWav->readCursorInPCMFrames < pWav->totalPCMFrameCount) {
        MA_DR_WAV_ASSERT(framesToRead > 0);
        if (pWav->msadpcm.cachedFrameCount == 0 && pWav->msadpcm.bytesRemainingInBlock == 0) {
            if (pWav->channels == 1) {
                ma_uint8 header[7];
                if (pWav->onRead(pWav->pUserData, header, sizeof(header)) != sizeof(header)) {
                    return totalFramesRead;
                }
                pWav->msadpcm.bytesRemainingInBlock = pWav->fmt.blockAlign - sizeof(header);
                pWav->msadpcm.predictor[0]     = header[0];
                pWav->msadpcm.delta[0]         = ma_dr_wav_bytes_to_s16(header + 1);
                pWav->msadpcm.prevFrames[0][1] = (ma_int32)ma_dr_wav_bytes_to_s16(header + 3);
                pWav->msadpcm.prevFrames[0][0] = (ma_int32)ma_dr_wav_bytes_to_s16(header + 5);
                pWav->msadpcm.cachedFrames[2]  = pWav->msadpcm.prevFrames[0][0];
                pWav->msadpcm.cachedFrames[3]  = pWav->msadpcm.prevFrames[0][1];
                pWav->msadpcm.cachedFrameCount = 2;
                if (pWav->msadpcm.predictor[0] >= ma_dr_wav_countof(coeff1Table)) {
                    return totalFramesRead;
                }
            } else {
                ma_uint8 header[14];
                if (pWav->onRead(pWav->pUserData, header, sizeof(header)) != sizeof(header)) {
                    return totalFramesRead;
                }
                pWav->msadpcm.bytesRemainingInBlock = pWav->fmt.blockAlign - sizeof(header);
                pWav->msadpcm.predictor[0] = header[0];
                pWav->msadpcm.predictor[1] = header[1];
                pWav->msadpcm.delta[0] = ma_dr_wav_bytes_to_s16(header + 2);
                pWav->msadpcm.delta[1] = ma_dr_wav_bytes_to_s16(header + 4);
                pWav->msadpcm.prevFrames[0][1] = (ma_int32)ma_dr_wav_bytes_to_s16(header + 6);
                pWav->msadpcm.prevFrames[1][1] = (ma_int32)ma_dr_wav_bytes_to_s16(header + 8);
                pWav->msadpcm.prevFrames[0][0] = (ma_int32)ma_dr_wav_bytes_to_s16(header + 10);
                pWav->msadpcm.prevFrames[1][0] = (ma_int32)ma_dr_wav_bytes_to_s16(header + 12);
                pWav->msadpcm.cachedFrames[0] = pWav->msadpcm.prevFrames[0][0];
                pWav->msadpcm.cachedFrames[1] = pWav->msadpcm.prevFrames[1][0];
                pWav->msadpcm.cachedFrames[2] = pWav->msadpcm.prevFrames[0][1];
                pWav->msadpcm.cachedFrames[3] = pWav->msadpcm.prevFrames[1][1];
                pWav->msadpcm.cachedFrameCount = 2;
                if (pWav->msadpcm.predictor[0] >= ma_dr_wav_countof(coeff1Table) || pWav->msadpcm.predictor[1] >= ma_dr_wav_countof(coeff2Table)) {
                    return totalFramesRead;
                }
            }
        }
        while (framesToRead > 0 && pWav->msadpcm.cachedFrameCount > 0 && pWav->readCursorInPCMFrames < pWav->totalPCMFrameCount) {
            if (pBufferOut != NULL) {
                ma_uint32 iSample = 0;
                for (iSample = 0; iSample < pWav->channels; iSample += 1) {
                    pBufferOut[iSample] = (ma_int16)pWav->msadpcm.cachedFrames[(ma_dr_wav_countof(pWav->msadpcm.cachedFrames) - (pWav->msadpcm.cachedFrameCount*pWav->channels)) + iSample];
                }
                pBufferOut += pWav->channels;
            }
            framesToRead    -= 1;
            totalFramesRead += 1;
            pWav->readCursorInPCMFrames += 1;
            pWav->msadpcm.cachedFrameCount -= 1;
        }
        if (framesToRead == 0) {
            break;
        }
        if (pWav->msadpcm.cachedFrameCount == 0) {
            if (pWav->msadpcm.bytesRemainingInBlock == 0) {
                continue;
            } else {
                ma_uint8 nibbles;
                ma_int32 nibble0;
                ma_int32 nibble1;
                if (pWav->onRead(pWav->pUserData, &nibbles, 1) != 1) {
                    return totalFramesRead;
                }
                pWav->msadpcm.bytesRemainingInBlock -= 1;
                nibble0 = ((nibbles & 0xF0) >> 4); if ((nibbles & 0x80)) { nibble0 |= 0xFFFFFFF0UL; }
                nibble1 = ((nibbles & 0x0F) >> 0); if ((nibbles & 0x08)) { nibble1 |= 0xFFFFFFF0UL; }
                if (pWav->channels == 1) {
                    ma_int32 newSample0;
                    ma_int32 newSample1;
                    newSample0  = ((pWav->msadpcm.prevFrames[0][1] * coeff1Table[pWav->msadpcm.predictor[0]]) + (pWav->msadpcm.prevFrames[0][0] * coeff2Table[pWav->msadpcm.predictor[0]])) >> 8;
                    newSample0 += nibble0 * pWav->msadpcm.delta[0];
                    newSample0  = ma_dr_wav_clamp(newSample0, -32768, 32767);
                    pWav->msadpcm.delta[0] = (adaptationTable[((nibbles & 0xF0) >> 4)] * pWav->msadpcm.delta[0]) >> 8;
                    if (pWav->msadpcm.delta[0] < 16) {
                        pWav->msadpcm.delta[0] = 16;
                    }
                    pWav->msadpcm.prevFrames[0][0] = pWav->msadpcm.prevFrames[0][1];
                    pWav->msadpcm.prevFrames[0][1] = newSample0;
                    newSample1  = ((pWav->msadpcm.prevFrames[0][1] * coeff1Table[pWav->msadpcm.predictor[0]]) + (pWav->msadpcm.prevFrames[0][0] * coeff2Table[pWav->msadpcm.predictor[0]])) >> 8;
                    newSample1 += nibble1 * pWav->msadpcm.delta[0];
                    newSample1  = ma_dr_wav_clamp(newSample1, -32768, 32767);
                    pWav->msadpcm.delta[0] = (adaptationTable[((nibbles & 0x0F) >> 0)] * pWav->msadpcm.delta[0]) >> 8;
                    if (pWav->msadpcm.delta[0] < 16) {
                        pWav->msadpcm.delta[0] = 16;
                    }
                    pWav->msadpcm.prevFrames[0][0] = pWav->msadpcm.prevFrames[0][1];
                    pWav->msadpcm.prevFrames[0][1] = newSample1;
                    pWav->msadpcm.cachedFrames[2] = newSample0;
                    pWav->msadpcm.cachedFrames[3] = newSample1;
                    pWav->msadpcm.cachedFrameCount = 2;
                } else {
                    ma_int32 newSample0;
                    ma_int32 newSample1;
                    newSample0  = ((pWav->msadpcm.prevFrames[0][1] * coeff1Table[pWav->msadpcm.predictor[0]]) + (pWav->msadpcm.prevFrames[0][0] * coeff2Table[pWav->msadpcm.predictor[0]])) >> 8;
                    newSample0 += nibble0 * pWav->msadpcm.delta[0];
                    newSample0  = ma_dr_wav_clamp(newSample0, -32768, 32767);
                    pWav->msadpcm.delta[0] = (adaptationTable[((nibbles & 0xF0) >> 4)] * pWav->msadpcm.delta[0]) >> 8;
                    if (pWav->msadpcm.delta[0] < 16) {
                        pWav->msadpcm.delta[0] = 16;
                    }
                    pWav->msadpcm.prevFrames[0][0] = pWav->msadpcm.prevFrames[0][1];
                    pWav->msadpcm.prevFrames[0][1] = newSample0;
                    newSample1  = ((pWav->msadpcm.prevFrames[1][1] * coeff1Table[pWav->msadpcm.predictor[1]]) + (pWav->msadpcm.prevFrames[1][0] * coeff2Table[pWav->msadpcm.predictor[1]])) >> 8;
                    newSample1 += nibble1 * pWav->msadpcm.delta[1];
                    newSample1  = ma_dr_wav_clamp(newSample1, -32768, 32767);
                    pWav->msadpcm.delta[1] = (adaptationTable[((nibbles & 0x0F) >> 0)] * pWav->msadpcm.delta[1]) >> 8;
                    if (pWav->msadpcm.delta[1] < 16) {
                        pWav->msadpcm.delta[1] = 16;
                    }
                    pWav->msadpcm.prevFrames[1][0] = pWav->msadpcm.prevFrames[1][1];
                    pWav->msadpcm.prevFrames[1][1] = newSample1;
                    pWav->msadpcm.cachedFrames[2] = newSample0;
                    pWav->msadpcm.cachedFrames[3] = newSample1;
                    pWav->msadpcm.cachedFrameCount = 1;
                }
            }
        }
    }
    return totalFramesRead;
}